

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

wostream * mjs::operator<<(wostream *os,token *t)

{
  token_type tVar1;
  wostream *pwVar2;
  wstring_view *s;
  wstring local_48;
  size_type local_28;
  uint64_t local_20;
  
  pwVar2 = std::operator<<(os,"token{");
  operator<<(pwVar2,t->type_);
  tVar1 = t->type_;
  if ((tVar1 == identifier) || (tVar1 == string_literal)) {
    pwVar2 = std::operator<<(os,", \"");
    if ((t->type_ != identifier) && (t->type_ != string_literal)) {
      __assert_fail("has_text()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h",
                    0xd6,"const std::wstring &mjs::token::text() const");
    }
    local_20 = (t->field_1).ivalue_;
    local_28 = (t->field_1).text_._M_string_length;
    cpp_quote_abi_cxx11_(&local_48,(mjs *)&local_28,s);
    pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (pwVar2,local_48._M_dataplus._M_p,local_48._M_string_length);
    std::operator<<(pwVar2,"\"");
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
    }
  }
  else if (tVar1 == numeric_literal) {
    std::operator<<(os,", ");
    std::wostream::_M_insert<double>((t->field_1).dvalue_);
  }
  pwVar2 = std::operator<<(os,"}");
  return pwVar2;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const token& t) {
    os << "token{" << t.type();
    if (t.type() == token_type::numeric_literal) {
        os << ", " << t.dvalue_;
    } else if (t.has_text()) {
        os << ", \"" << cpp_quote(t.text()) << "\"";
    }
    return os << "}";
}